

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O1

void __thiscall cmCTestSVN::cmCTestSVN(cmCTestSVN *this,cmCTest *ct,ostream *log)

{
  cmCTestGlobalVC::cmCTestGlobalVC(&this->super_cmCTestGlobalVC,ct,log);
  (this->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC =
       (_func_int **)&PTR__cmCTestSVN_0095e4b8;
  (this->Repositories).super__List_base<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->Repositories;
  (this->Repositories).super__List_base<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->Repositories;
  (this->Repositories).super__List_base<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>.
  _M_impl._M_node._M_size = 0;
  std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).PriorRev);
  std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).PriorRev.Date);
  std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).PriorRev.Author);
  std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).PriorRev.EMail);
  std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).PriorRev.Committer);
  std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).PriorRev.CommitterEMail);
  std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).PriorRev.CommitDate);
  std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).PriorRev.Log);
  return;
}

Assistant:

cmCTestSVN::cmCTestSVN(cmCTest* ct, std::ostream& log)
  : cmCTestGlobalVC(ct, log)
{
  this->PriorRev = this->Unknown;
}